

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

ZSTD_frameProgression *
duckdb_zstd::ZSTD_getFrameProgression(ZSTD_frameProgression *__return_storage_ptr__,ZSTD_CCtx *cctx)

{
  unsigned_long_long uVar1;
  long lVar2;
  
  if (cctx->inBuff == (char *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = cctx->inBuffPos - cctx->inToCompress;
  }
  uVar1 = cctx->consumedSrcSize;
  __return_storage_ptr__->ingested = lVar2 + uVar1;
  __return_storage_ptr__->consumed = uVar1;
  uVar1 = cctx->producedCSize;
  __return_storage_ptr__->produced = uVar1;
  __return_storage_ptr__->flushed = uVar1;
  __return_storage_ptr__->currentJobID = 0;
  __return_storage_ptr__->nbActiveWorkers = 0;
  return __return_storage_ptr__;
}

Assistant:

ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx* cctx)
{
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        return ZSTDMT_getFrameProgression(cctx->mtctx);
    }
#endif
    {   ZSTD_frameProgression fp;
        size_t const buffered = (cctx->inBuff == NULL) ? 0 :
                                cctx->inBuffPos - cctx->inToCompress;
        if (buffered) assert(cctx->inBuffPos >= cctx->inToCompress);
        assert(buffered <= ZSTD_BLOCKSIZE_MAX);
        fp.ingested = cctx->consumedSrcSize + buffered;
        fp.consumed = cctx->consumedSrcSize;
        fp.produced = cctx->producedCSize;
        fp.flushed  = cctx->producedCSize;   /* simplified; some data might still be left within streaming output buffer */
        fp.currentJobID = 0;
        fp.nbActiveWorkers = 0;
        return fp;
}   }